

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUpdateLeft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *vec)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  pointer pnVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  undefined8 uVar8;
  cpp_dec_float<50U,_int,_void> *pcVar9;
  cpp_dec_float<50U,_int,_void> *v;
  long lVar10;
  int iVar11;
  cpp_dec_float<50U,_int,_void> *pcVar12;
  int *piVar13;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  iVar2 = (this->l).firstUpdate;
  iVar3 = (this->l).firstUnused;
  lVar10 = (long)iVar3;
  if (iVar2 < iVar3) {
    pnVar4 = (this->l).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar5 = (this->l).idx;
    piVar6 = (this->l).row;
    piVar7 = (this->l).start;
    do {
      iVar3 = piVar7[lVar10 + -1];
      iVar11 = piVar6[lVar10 + -1];
      local_68.data._M_elems[0] = vec[iVar11].m_backend.data._M_elems[0];
      local_68.data._M_elems[9] = vec[iVar11].m_backend.data._M_elems[9];
      puVar1 = vec[iVar11].m_backend.data._M_elems + 5;
      local_68.data._M_elems._20_8_ = *(undefined8 *)puVar1;
      local_68.data._M_elems._28_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = vec[iVar11].m_backend.data._M_elems + 1;
      local_68.data._M_elems._4_8_ = *(undefined8 *)puVar1;
      local_68.data._M_elems._12_8_ = *(undefined8 *)(puVar1 + 2);
      local_68.exp = vec[iVar11].m_backend.exp;
      local_68.fpclass = vec[iVar11].m_backend.fpclass;
      local_68.prec_elem = vec[iVar11].m_backend.prec_elem;
      local_68.neg = (bool)((local_68.data._M_elems[0] != 0 ||
                            local_68.fpclass != cpp_dec_float_finite) ^ vec[iVar11].m_backend.neg);
      iVar11 = piVar7[lVar10];
      if (iVar3 < iVar11) {
        piVar13 = piVar5 + iVar3;
        pcVar12 = &pnVar4[iVar3].m_backend;
        do {
          pcVar9 = &vec[*piVar13].m_backend;
          local_a8.fpclass = cpp_dec_float_finite;
          local_a8.prec_elem = 10;
          local_a8.data._M_elems[0] = 0;
          local_a8.data._M_elems[1] = 0;
          local_a8.data._M_elems[2] = 0;
          local_a8.data._M_elems[3] = 0;
          local_a8.data._M_elems[4] = 0;
          local_a8.data._M_elems[5] = 0;
          local_a8.data._M_elems._24_5_ = 0;
          local_a8.data._M_elems[7]._1_3_ = 0;
          local_a8.data._M_elems._32_5_ = 0;
          local_a8.data._M_elems[9]._1_3_ = 0;
          local_a8.exp = 0;
          local_a8.neg = false;
          v = pcVar9;
          if ((pcVar12 != &local_a8) && (v = pcVar12, &local_a8 != pcVar9)) {
            uVar8 = *(undefined8 *)((pcVar9->data)._M_elems + 8);
            local_a8.data._M_elems._32_5_ = SUB85(uVar8,0);
            local_a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
            local_a8.data._M_elems._0_8_ = *(undefined8 *)(pcVar9->data)._M_elems;
            local_a8.data._M_elems._8_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 2);
            local_a8.data._M_elems._16_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 4);
            uVar8 = *(undefined8 *)((pcVar9->data)._M_elems + 6);
            local_a8.data._M_elems._24_5_ = SUB85(uVar8,0);
            local_a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
            local_a8.exp = pcVar9->exp;
            local_a8.neg = pcVar9->neg;
            local_a8.fpclass = pcVar9->fpclass;
            local_a8.prec_elem = pcVar9->prec_elem;
          }
          piVar13 = piVar13 + 1;
          pcVar12 = pcVar12 + 1;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_a8,v);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_68,&local_a8);
          iVar11 = iVar11 + -1;
        } while (iVar3 < iVar11);
      }
      lVar10 = lVar10 + -1;
      iVar3 = piVar6[lVar10];
      vec[iVar3].m_backend.data._M_elems[0] = local_68.data._M_elems[0];
      puVar1 = vec[iVar3].m_backend.data._M_elems + 1;
      *(undefined8 *)puVar1 = local_68.data._M_elems._4_8_;
      *(undefined8 *)(puVar1 + 2) = local_68.data._M_elems._12_8_;
      puVar1 = vec[iVar3].m_backend.data._M_elems + 5;
      *(undefined8 *)puVar1 = local_68.data._M_elems._20_8_;
      *(undefined8 *)(puVar1 + 2) = local_68.data._M_elems._28_8_;
      vec[iVar3].m_backend.data._M_elems[9] = local_68.data._M_elems[9];
      vec[iVar3].m_backend.exp = local_68.exp;
      vec[iVar3].m_backend.neg =
           (bool)((local_68.data._M_elems[0] != 0 || local_68.fpclass != cpp_dec_float_finite) ^
                 local_68.neg);
      vec[iVar3].m_backend.fpclass = local_68.fpclass;
      vec[iVar3].m_backend.prec_elem = local_68.prec_elem;
    } while (iVar2 < lVar10);
  }
  return;
}

Assistant:

void CLUFactor<R>::solveUpdateLeft(R* vec)
{
   int i, j, k, end;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   assert(!l.updateType);               /* Forest-Tomlin Updates */

   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      k = lbeg[i];
      val = &lval[k];
      idx = &lidx[k];
      StableSum<R> tmp(-vec[lrow[i]]);

      for(j = lbeg[i + 1]; j > k; --j)
         tmp += vec[*idx++] * (*val++);

      vec[lrow[i]] = -R(tmp);
   }
}